

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O0

void __thiscall InfoListWnd::InfoListWnd(InfoListWnd *this,WndMode _mode)

{
  undefined1 *puVar1;
  undefined8 *in_RDI;
  WndStyle in_stack_00000018;
  WndMode in_stack_0000001c;
  LTImgWindow *in_stack_00000020;
  WndRect in_stack_00000028;
  char buf [100];
  InfoListWnd *in_stack_fffffffffffffec8;
  char *__s;
  ACTable *in_stack_fffffffffffffed0;
  ImgWindow *this_00;
  string *title;
  ImgWindow *this_01;
  allocator<char> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char local_c8 [104];
  string local_60 [55];
  allocator<char> local_29;
  WndPos local_28;
  WndPos WStack_20;
  
  local_28 = dataRefs.ILWrect.tl;
  WStack_20 = dataRefs.ILWrect.br;
  LTImgWindow::LTImgWindow(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000028);
  *in_RDI = &PTR__InfoListWnd_0046bf40;
  *(undefined4 *)(in_RDI + 0x2b) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::allocator<char>::~allocator(&local_29);
  ACTable::ACTable(in_stack_fffffffffffffed0,SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
  *(undefined1 *)(in_RDI + 0x3a) = 0;
  puVar1 = (undefined1 *)((long)in_RDI + 0x1d1);
  do {
    *puVar1 = 0;
    puVar1 = puVar1 + 1;
  } while (puVar1 != (undefined1 *)((long)in_RDI + 0x202));
  *(undefined4 *)((long)in_RDI + 0x204) = 0x3f;
  *(undefined1 *)(in_RDI + 0x41) = 0;
  puVar1 = (undefined1 *)((long)in_RDI + 0x209);
  do {
    *puVar1 = 0;
    puVar1 = puVar1 + 1;
  } while (puVar1 != (undefined1 *)((long)in_RDI + 0x23a));
  this_00 = (ImgWindow *)(in_RDI + 0x48);
  std::__cxx11::
  list<std::_List_const_iterator<LogMsgTy>,_std::allocator<std::_List_const_iterator<LogMsgTy>_>_>::
  list((list<std::_List_const_iterator<LogMsgTy>,_std::allocator<std::_List_const_iterator<LogMsgTy>_>_>
        *)0x1723bb);
  in_RDI[0x4b] = 0;
  in_RDI[0x4c] = 0;
  *(undefined4 *)(in_RDI + 0x4d) = 0;
  title = (string *)(in_RDI + 0x4e);
  std::__cxx11::string::string((string *)title);
  this_01 = (ImgWindow *)(in_RDI + 0x52);
  std::__cxx11::string::string((string *)this_01);
  *(undefined4 *)(in_RDI + 0x56) = 0x447d5000;
  std::__cxx11::string::string((string *)(in_RDI + 0x57));
  std::__cxx11::string::string((string *)(in_RDI + 0x5b));
  *(undefined4 *)(in_RDI + 0x5f) = 0xffffffff;
  GetWndTitle_abi_cxx11_(in_stack_fffffffffffffec8);
  ImgWindow::SetWindowTitle(this_01,title);
  std::__cxx11::string::~string(local_60);
  ImgWindow::SetWindowResizingLimits
            (this_00,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8,
             0,0x17249f);
  in_RDI[0x26] = "using-lt/info-list-window";
  __s = local_c8;
  snprintf(__s,100,"LiveTraffic %s",LT_VERSION_FULL);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x4e),__s);
  *(byte *)(in_RDI + 0x30) = gIlwState.bFilterAcOnly & 1;
  strncpy((char *)(in_RDI + 0x3a),gIlwState.sAcFilter,0x32);
  *(uint *)((long)in_RDI + 0x204) = gIlwState.msgLvlFilter;
  strncpy((char *)(in_RDI + 0x41),gIlwState.sMsgFilter,0x32);
  return;
}

Assistant:

InfoListWnd::InfoListWnd(WndMode _mode) :
LTImgWindow(_mode, WND_STYLE_HUD, dataRefs.ILWrect),
wndTitle(LIVE_TRAFFIC)
{
    // Set up window basics
    SetWindowTitle(GetWndTitle());
    SetWindowResizingLimits(ILW_RESIZE_LIMITS.tl.x, ILW_RESIZE_LIMITS.tl.y,
                            ILW_RESIZE_LIMITS.br.x, ILW_RESIZE_LIMITS.br.y);
    
    // Define Help URL to open for Help (?) button
    szHelpURL = HELP_ILW;
    
    // Compute version info text
    char buf[100];
    if constexpr (LIVETRAFFIC_VERSION_BETA)
        snprintf(buf, sizeof(buf), LIVE_TRAFFIC " %s, BETA version limited to %s",
                LT_VERSION_FULL, LT_BETA_VER_LIMIT_TXT);
    else
        snprintf(buf, sizeof(buf), LIVE_TRAFFIC " %s", LT_VERSION_FULL);
    verText = buf;
    
    // Restore state
    acList.bFilterAcOnly = gIlwState.bFilterAcOnly;
    strncpy(sAcFilter, gIlwState.sAcFilter, sizeof(sAcFilter));
    msgLvlFilter = gIlwState.msgLvlFilter;
    strncpy(sMsgFilter, gIlwState.sMsgFilter, sizeof(sMsgFilter));
}